

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::LegacyScriptPubKeyMan
          (LegacyScriptPubKeyMan *this,WalletStorage *storage,int64_t keypool_size)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  LegacyDataSPKM::ScriptPubKeyMan(&this->super_LegacyDataSPKM,storage);
  (this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan =
       (_func_int **)&PTR__LegacyScriptPubKeyMan_006407e8;
  (this->super_LegacyDataSPKM).super_FillableSigningProvider.super_SigningProvider.
  _vptr_SigningProvider = (_func_int **)&PTR__LegacyScriptPubKeyMan_00640928;
  this->encrypted_batch = (WalletBatch *)0x0;
  this->nTimeFirstKey = 0x7fffffffffffffff;
  this->m_keypool_size = keypool_size;
  p_Var1 = &(this->m_index_to_reserved_key)._M_t._M_impl.super__Rb_tree_header;
  (this->m_index_to_reserved_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_index_to_reserved_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_index_to_reserved_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_index_to_reserved_key)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_index_to_reserved_key)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan(WalletStorage& storage, int64_t keypool_size) : LegacyDataSPKM(storage), m_keypool_size(keypool_size) {}